

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

MMDB_lookup_result_s *
MMDB_lookup_sockaddr
          (MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,sockaddr *sockaddr,
          int *mmdb_error)

{
  int iVar1;
  MMDB_lookup_result_s *result;
  uint8_t *address;
  uint8_t mapped_address [16];
  int *mmdb_error_local;
  sockaddr *sockaddr_local;
  MMDB_s *mmdb_local;
  
  memset(__return_storage_ptr__,0,0x20);
  (__return_storage_ptr__->entry).mmdb = mmdb;
  if ((mmdb->metadata).ip_version == 4) {
    if (sockaddr->sa_family == 10) {
      *mmdb_error = 0xb;
      return __return_storage_ptr__;
    }
    result = (MMDB_lookup_result_s *)(sockaddr->sa_data + 2);
  }
  else if (sockaddr->sa_family == 10) {
    result = (MMDB_lookup_result_s *)(sockaddr->sa_data + 6);
  }
  else {
    result = (MMDB_lookup_result_s *)&address;
    memset(&address,0,0xc);
    mapped_address._4_4_ = *(undefined4 *)(sockaddr->sa_data + 2);
  }
  iVar1 = find_address_in_search_tree
                    (mmdb,&result->found_entry,sockaddr->sa_family,__return_storage_ptr__);
  *mmdb_error = iVar1;
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s MMDB_lookup_sockaddr(const MMDB_s *const mmdb,
                                          const struct sockaddr *const sockaddr,
                                          int *const mmdb_error) {
    MMDB_lookup_result_s result = {.found_entry = false,
                                   .netmask = 0,
                                   .entry = {.mmdb = mmdb, .offset = 0}};

    uint8_t mapped_address[16];
    uint8_t const *address;
    if (mmdb->metadata.ip_version == 4) {
        if (sockaddr->sa_family == AF_INET6) {
            *mmdb_error = MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR;
            return result;
        }
        address = (uint8_t const *)&((struct sockaddr_in const *)sockaddr)
                      ->sin_addr.s_addr;
    } else {
        if (sockaddr->sa_family == AF_INET6) {
            address = (uint8_t const *)&((struct sockaddr_in6 const *)sockaddr)
                          ->sin6_addr.s6_addr;
        } else {
            address = mapped_address;
            memset(mapped_address, 0, 12);
            memcpy(mapped_address + 12,
                   &((struct sockaddr_in const *)sockaddr)->sin_addr.s_addr,
                   4);
        }
    }

    *mmdb_error = find_address_in_search_tree(
        mmdb, address, sockaddr->sa_family, &result);

    return result;
}